

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O0

_Bool Hacl_RSAPSS_rsapss_pkey_verify
                (Spec_Hash_Definitions_hash_alg a,uint32_t modBits,uint32_t eBits,uint8_t *nb,
                uint8_t *eb,uint32_t saltLen,uint32_t sgntLen,uint8_t *sgnt,uint32_t msgLen,
                uint8_t *msg)

{
  long lVar1;
  uint32_t uVar2;
  uint8_t *eb_00;
  uint8_t *nb_00;
  uint32_t uVar3;
  uint32_t modBits_00;
  Spec_Hash_Definitions_hash_alg a_00;
  ulong uVar4;
  uint64_t *puVar5;
  undefined8 auStack_80 [2];
  uint32_t auStack_70 [2];
  uint64_t auStack_68 [3];
  uint64_t *local_50;
  _Bool local_41;
  long lStack_40;
  _Bool b;
  unsigned_long __vla_expr0;
  uint32_t local_2c;
  uint8_t *puStack_28;
  uint32_t saltLen_local;
  uint8_t *eb_local;
  uint8_t *nb_local;
  uint32_t local_10;
  uint32_t eBits_local;
  uint32_t modBits_local;
  Spec_Hash_Definitions_hash_alg a_local;
  
  __vla_expr0 = (unsigned_long)(auStack_68 + 2);
  local_2c = saltLen;
  puStack_28 = eb;
  eb_local = nb;
  nb_local._4_4_ = eBits;
  local_10 = modBits;
  eBits_local._2_1_ = a;
  if (0x1fffffffffffffff < (ulong)(((modBits - 1 >> 6) + 1) * 2 + (eBits - 1 >> 6) + 1)) {
    auStack_68[1] = 0x271af5;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_RSAPSS.c"
           ,0x35f);
    auStack_68[1] = 0x271aff;
    exit(0xfd);
  }
  uVar4 = (ulong)((eBits - 1 >> 6) + (modBits - 1 >> 6) * 2);
  lStack_40 = uVar4 + 3;
  lVar1 = -(uVar4 * 8 + 0x27 & 0xfffffffffffffff0);
  puVar5 = (uint64_t *)((long)auStack_68 + lVar1 + 0x10);
  local_50 = puVar5;
  *(undefined8 *)((long)auStack_68 + lVar1 + 8) = 0x271b70;
  memset(puVar5,0,(ulong)(((modBits - 1 >> 6) + 1) * 2 + (eBits - 1 >> 6) + 1) << 3);
  uVar3 = local_10;
  uVar2 = nb_local._4_4_;
  nb_00 = eb_local;
  eb_00 = puStack_28;
  puVar5 = local_50;
  *(undefined8 *)((long)auStack_68 + lVar1 + 8) = 0x271b87;
  local_41 = load_pkey(uVar3,uVar2,nb_00,eb_00,puVar5);
  a_00 = eBits_local._2_1_;
  modBits_00 = local_10;
  uVar3 = nb_local._4_4_;
  uVar2 = local_2c;
  puVar5 = local_50;
  if (local_41) {
    *(uint8_t **)((long)auStack_80 + lVar1 + 8) = sgnt;
    *(uint32_t *)((long)auStack_70 + lVar1) = msgLen;
    *(uint8_t **)((long)auStack_68 + lVar1) = msg;
    *(undefined8 *)((long)auStack_80 + lVar1) = 0x271bcf;
    eBits_local._3_1_ =
         Hacl_RSAPSS_rsapss_verify
                   (a_00,modBits_00,uVar3,puVar5,uVar2,sgntLen,
                    *(uint8_t **)((long)auStack_80 + lVar1 + 8),
                    *(uint32_t *)((long)auStack_70 + lVar1),*(uint8_t **)((long)auStack_68 + lVar1))
    ;
  }
  else {
    eBits_local._3_1_ = false;
  }
  return eBits_local._3_1_;
}

Assistant:

bool
Hacl_RSAPSS_rsapss_pkey_verify(
  Spec_Hash_Definitions_hash_alg a,
  uint32_t modBits,
  uint32_t eBits,
  uint8_t *nb,
  uint8_t *eb,
  uint32_t saltLen,
  uint32_t sgntLen,
  uint8_t *sgnt,
  uint32_t msgLen,
  uint8_t *msg
)
{
  KRML_CHECK_SIZE(sizeof (uint64_t), 2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U);
  uint64_t pkey[2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U];
  memset(pkey,
    0U,
    (2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U) * sizeof (uint64_t));
  bool b = load_pkey(modBits, eBits, nb, eb, pkey);
  if (b)
  {
    return Hacl_RSAPSS_rsapss_verify(a, modBits, eBits, pkey, saltLen, sgntLen, sgnt, msgLen, msg);
  }
  return false;
}